

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O2

void av1_first_pass(AV1_COMP *cpi,int64_t ts_duration)

{
  AV1_COMMON *cm_00;
  ThreadData_conflict *td;
  CommonModeInfoParams *mi_params;
  MACROBLOCKD *xd;
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  uint uVar7;
  SequenceHeader *pSVar8;
  FRAME_STATS *mb_stats;
  AV1_PRIMARY *pAVar9;
  FIRSTPASS_STATS *pFVar10;
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  int iVar14;
  int num_planes;
  int iVar15;
  RefCntBuffer *pRVar16;
  ulong uVar17;
  ulong uVar18;
  int *piVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  BLOCK_SIZE fp_block_size;
  scale_factors *psVar23;
  YV12_BUFFER_CONFIG *src;
  TileDataEnc *tile_data;
  bool bVar24;
  bool bVar25;
  double dVar26;
  double dVar27;
  YV12_BUFFER_CONFIG *local_108;
  AV1_COMMON *cm;
  undefined1 local_a8 [120];
  
  pSVar8 = (cpi->common).seq_params;
  uVar1 = pSVar8->monochrome;
  iVar12 = find_fp_qindex(pSVar8->bit_depth);
  iVar5 = cpi->ref_frame_flags;
  cpi->ref_frame_flags = 9;
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
    (cpi->td).mb.e_mbd.cur_buf = cpi->source;
    av1_set_screen_content_options(cpi,&(cpi->common).features);
  }
  av1_set_speed_features_framesize_independent(cpi,(cpi->oxcf).speed);
  fp_block_size = (cpi->is_screen_content_type == 0) * '\x03' + BLOCK_8X8;
  iVar14 = (cpi->oxcf).frm_dim_cfg.forced_max_frame_width;
  iVar13 = (cpi->oxcf).frm_dim_cfg.forced_max_frame_height;
  if (iVar14 == 0) {
    iVar14 = (cpi->common).mi_params.mb_cols;
  }
  else {
    iVar14 = (iVar14 + 7 >> 2) + 2 >> 2;
  }
  cm_00 = &cpi->common;
  if (iVar13 == 0) {
    iVar13 = (cpi->common).mi_params.mb_rows;
  }
  else {
    iVar13 = (iVar13 + 7 >> 2) + 2 >> 2;
  }
  iVar13 = get_unit_rows(fp_block_size,iVar13);
  iVar14 = get_unit_cols(fp_block_size,iVar14);
  cpi->fp_block_size = fp_block_size;
  setup_firstpass_data(cm_00,&cpi->firstpass_data,iVar13,iVar14);
  piVar19 = (cpi->firstpass_data).raw_motion_err_list;
  mb_stats = (cpi->firstpass_data).mb_stats;
  if (cpi->allocated_tiles < (cpi->common).tiles.rows * (cpi->common).tiles.cols) {
    av1_alloc_tile_data(cpi);
  }
  td = &cpi->td;
  mi_params = &(cpi->common).mi_params;
  num_planes = (uint)(uVar1 == '\0') * 2 + 1;
  xd = &(cpi->td).mb.e_mbd;
  av1_init_tile_data(cpi);
  if (((cpi->common).current_frame.frame_type & 0xfd) == 0) {
    bVar24 = true;
    local_108 = (YV12_BUFFER_CONFIG *)0x0;
  }
  else {
    av1_scale_references(cpi,EIGHTTAP_REGULAR,0,0);
    iVar6 = (cpi->common).remapped_ref_idx[0];
    lVar22 = (long)iVar6;
    psVar23 = (scale_factors *)0x0;
    if (lVar22 != -1) {
      psVar23 = (cpi->common).ref_scale_factors + lVar22;
    }
    iVar15 = av1_is_scaled(psVar23);
    if (iVar15 == 0) {
      if (iVar6 == -1) {
        pRVar16 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar16 = (cpi->common).ref_frame_map[lVar22];
      }
      local_108 = &pRVar16->buf;
      if (pRVar16 == (RefCntBuffer *)0x0) {
        local_108 = (YV12_BUFFER_CONFIG *)0x0;
      }
    }
    else {
      local_108 = av1_get_scaled_ref_frame(cpi,1);
    }
    iVar6 = (cpi->common).remapped_ref_idx[3];
    lVar22 = (long)iVar6;
    psVar23 = (scale_factors *)0x0;
    if (lVar22 != -1) {
      psVar23 = (cpi->common).ref_scale_factors + lVar22;
    }
    iVar15 = av1_is_scaled(psVar23);
    if (iVar15 == 0) {
      if (iVar6 == -1) {
        pRVar16 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar16 = (cpi->common).ref_frame_map[lVar22];
      }
    }
    else {
      pRVar16 = (RefCntBuffer *)av1_get_scaled_ref_frame(cpi,4);
    }
    bVar24 = pRVar16 == (RefCntBuffer *)0x0;
  }
  src = &((cpi->common).cur_frame)->buf;
  av1_setup_frame_size(cpi);
  av1_set_mv_search_params(cpi);
  set_mi_offsets(mi_params,xd,0,0);
  (*(cpi->td).mb.e_mbd.mi)->bsize = fp_block_size;
  (cpi->rc).frames_to_key = 0x7fffffff;
  av1_set_quantizer(cm_00,(cpi->oxcf).q_cfg.qm_minlevel,(cpi->oxcf).q_cfg.qm_maxlevel,iVar12,
                    (uint)(cpi->oxcf).q_cfg.enable_chroma_deltaq,
                    (uint)(cpi->oxcf).q_cfg.enable_hdr_deltaq,(cpi->oxcf).mode == '\x02',
                    (cpi->oxcf).tune_cfg.tuning);
  av1_setup_block_planes(xd,pSVar8->subsampling_x,pSVar8->subsampling_y,num_planes);
  av1_setup_src_planes(&td->mb,cpi->source,0,0,num_planes,fp_block_size);
  av1_setup_dst_planes((cpi->td).mb.e_mbd.plane,pSVar8->sb_size,src,0,0,0,num_planes);
  if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
    av1_setup_pre_planes(xd,0,local_108,0,0,(scale_factors *)0x0,num_planes);
  }
  set_mi_offsets(mi_params,xd,0,0);
  (cpi->td).mb.e_mbd.cfl.store_y = 0;
  av1_frame_init_quantizer(cpi);
  av1_default_coef_probs(cm_00);
  av1_init_mode_probs((cpi->common).fc);
  av1_init_mv_probs(cm_00);
  av1_initialize_rd_consts(cpi);
  (cpi->mt_info).enc_row_mt.sync_read_ptr = av1_row_mt_sync_read_dummy;
  (cpi->mt_info).enc_row_mt.sync_write_ptr = av1_row_mt_sync_write_dummy;
  if ((cpi->mt_info).num_workers < 2) {
    uVar20 = (cpi->common).tiles.cols;
    uVar7 = (cpi->common).tiles.rows;
    av1_alloc_src_diff_buf(cm_00,&td->mb);
    uVar17 = 0;
    if (0 < (int)uVar20) {
      uVar17 = (ulong)uVar20;
    }
    if ((int)uVar7 < 1) {
      uVar7 = 0;
    }
    for (uVar21 = 0; uVar21 != uVar7; uVar21 = uVar21 + 1) {
      for (uVar18 = 0; uVar18 != uVar17; uVar18 = uVar18 + 1) {
        bVar2 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                [fp_block_size];
        bVar3 = ""[fp_block_size];
        tile_data = cpi->tile_data + uVar18 + uVar21 * (long)(int)uVar20;
        for (iVar12 = cpi->tile_data[uVar18 + uVar21 * (long)(int)uVar20].tile_info.mi_row_start;
            iVar12 < (tile_data->tile_info).mi_row_end; iVar12 = iVar12 + (uint)bVar2) {
          av1_first_pass_row(cpi,td,tile_data,iVar12 >> (bVar3 & 0x1f),fp_block_size);
        }
      }
    }
  }
  else {
    (cpi->mt_info).enc_row_mt.sync_read_ptr = av1_row_mt_sync_read;
    (cpi->mt_info).enc_row_mt.sync_write_ptr = av1_row_mt_sync_write;
    av1_fp_encode_tiles_row_mt(cpi);
  }
  accumulate_frame_stats((FRAME_STATS *)local_a8,mb_stats,iVar13,iVar14);
  dVar26 = 0.0;
  if ((((cm_00->current_frame).frame_type & 0xfd) != 0) && (uVar20 = iVar13 * iVar14, uVar20 != 0))
  {
    uVar21 = 0;
    uVar17 = 0;
    if (0 < (int)uVar20) {
      uVar17 = (ulong)uVar20;
    }
    lVar22 = 0;
    for (; uVar17 != uVar21; uVar21 = uVar21 + 1) {
      lVar22 = lVar22 + piVar19[uVar21];
    }
    dVar26 = 0.0;
    for (uVar21 = 0; uVar17 != uVar21; uVar21 = uVar21 + 1) {
      dVar27 = (double)piVar19[uVar21] - (double)lVar22 / (double)(int)uVar20;
      dVar26 = dVar26 + dVar27 * dVar27;
    }
    dVar26 = dVar26 / (double)(int)uVar20;
    if (dVar26 < 0.0) {
      dVar26 = sqrt(dVar26);
    }
    else {
      dVar26 = SQRT(dVar26);
    }
  }
  av1_free_firstpass_data(&cpi->firstpass_data);
  av1_dealloc_src_diff_buf(&td->mb,(uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
  iVar13 = iVar13 / 2;
  iVar12 = iVar13;
  if ((int)local_a8._60_4_ < iVar13) {
    iVar12 = local_a8._60_4_;
  }
  bVar25 = local_a8._60_4_ == -1;
  local_a8._60_4_ = iVar12;
  if (bVar25) {
    local_a8._60_4_ = iVar13;
  }
  if (0 < (int)local_a8._60_4_) {
    iVar12 = local_a8._56_4_ + iVar14 * local_a8._60_4_ * -2;
    local_a8._56_4_ = 0;
    if (0 < iVar12) {
      local_a8._56_4_ = iVar12;
    }
  }
  pAVar9 = cpi->ppi;
  piVar19 = &cpi->initial_mbs;
  if ((cpi->oxcf).resize_cfg.resize_mode == '\0') {
    piVar19 = &(cpi->common).mi_params.MBs;
  }
  iVar12 = get_num_mbs(fp_block_size,*piVar19);
  auVar11._8_8_ = (double)iVar12;
  auVar11._0_8_ = (double)iVar12;
  local_a8._104_16_ = divpd(local_a8._104_16_,auVar11);
  pFVar10 = ((pAVar9->twopass).stats_buf_ctx)->stats_in_end;
  update_firstpass_stats
            (cpi,(FRAME_STATS *)local_a8,dVar26,(cpi->common).current_frame.frame_number,ts_duration
             ,fp_block_size);
  iVar12 = (pAVar9->twopass).sr_update_lag;
  if ((3 < iVar12) ||
     ((((cpi->common).current_frame.frame_number != 0 && (0.2 < pFVar10->pcnt_inter)) &&
      (2.0 < pFVar10->intra_error /
             (pFVar10->coded_error +
             *(double *)(&DAT_004358c0 + (ulong)(pFVar10->coded_error < 0.0) * 8)))))) {
    iVar12 = 1;
    if (!bVar24) {
      assign_frame_buffer_p
                ((cpi->common).ref_frame_map + (cpi->common).remapped_ref_idx[3],
                 (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[0]]);
    }
  }
  else {
    iVar12 = iVar12 + 1;
  }
  (pAVar9->twopass).sr_update_lag = iVar12;
  aom_extend_frame_borders_c(src,num_planes);
  assign_frame_buffer_p
            ((cpi->common).ref_frame_map + (cpi->common).remapped_ref_idx[0],(cpi->common).cur_frame
            );
  uVar20 = (cpi->common).current_frame.frame_number;
  if (uVar20 == 0) {
    lVar22 = (long)(cpi->common).remapped_ref_idx[3];
    if (lVar22 == -1) {
      uVar20 = 0;
    }
    else {
      assign_frame_buffer_p
                ((cpi->common).ref_frame_map + lVar22,
                 (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[0]]);
      uVar20 = (cpi->common).current_frame.frame_number;
    }
  }
  (cpi->common).current_frame.frame_number = uVar20 + 1;
  cpi->ref_frame_flags = iVar5;
  if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
    _Var4 = (cpi->refresh_frame).golden_frame;
    bVar2 = 1;
    for (lVar22 = 0x85a7; lVar22 != 0x85ae; lVar22 = lVar22 + 1) {
      piVar19 = *(int **)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar22 * 8);
      if (lVar22 == 0x85aa) {
        if (((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
            (((cpi->oxcf).mode == '\x01' &&
             (((cpi->oxcf).gf_cfg.lag_in_frames == 0 && (cpi->ppi->use_svc == 0)))))) &&
           (piVar19 != (int *)0x0)) {
          pRVar16 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[3]];
          if (piVar19[0x13c] == (pRVar16->buf).field_2.field_0.y_crop_width) {
            bVar24 = piVar19[0x13e] == (pRVar16->buf).field_3.field_0.y_crop_height;
          }
          else {
            bVar24 = false;
          }
          bVar3 = 1;
          if ((_Var4 != false) || (bVar24)) {
LAB_001b2ff6:
            *piVar19 = *piVar19 + -1;
            *(undefined8 *)
             ((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar22 * 8) = 0;
            bVar2 = bVar3;
          }
          else {
            bVar2 = 0;
          }
        }
        else {
          bVar3 = 1;
          if (!(bool)(~bVar2 & 1 | piVar19 == (int *)0x0)) goto LAB_001b2ff6;
          bVar2 = piVar19 == (int *)0x0 & bVar2;
        }
      }
      else {
        bVar3 = bVar2;
        if (piVar19 != (int *)0x0) goto LAB_001b2ff6;
      }
    }
  }
  return;
}

Assistant:

void av1_first_pass(AV1_COMP *cpi, const int64_t ts_duration) {
  MACROBLOCK *const x = &cpi->td.mb;
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  CurrentFrame *const current_frame = &cm->current_frame;
  const SequenceHeader *const seq_params = cm->seq_params;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  const int qindex = find_fp_qindex(seq_params->bit_depth);
  const int ref_frame_flags_backup = cpi->ref_frame_flags;
  cpi->ref_frame_flags = av1_ref_frame_flag_list[LAST_FRAME] |
                         av1_ref_frame_flag_list[GOLDEN_FRAME];

  // Detect if the key frame is screen content type.
  if (frame_is_intra_only(cm)) {
    FeatureFlags *const features = &cm->features;
    assert(cpi->source != NULL);
    xd->cur_buf = cpi->source;
    av1_set_screen_content_options(cpi, features);
  }

  // Prepare the speed features
  av1_set_speed_features_framesize_independent(cpi, cpi->oxcf.speed);

  // Unit size for the first pass encoding.
  const BLOCK_SIZE fp_block_size =
      get_fp_block_size(cpi->is_screen_content_type);

  int max_mb_rows = mi_params->mb_rows;
  int max_mb_cols = mi_params->mb_cols;
  if (cpi->oxcf.frm_dim_cfg.forced_max_frame_width) {
    int max_mi_cols = size_in_mi(cpi->oxcf.frm_dim_cfg.forced_max_frame_width);
    max_mb_cols = ROUND_POWER_OF_TWO(max_mi_cols, 2);
  }
  if (cpi->oxcf.frm_dim_cfg.forced_max_frame_height) {
    int max_mi_rows = size_in_mi(cpi->oxcf.frm_dim_cfg.forced_max_frame_height);
    max_mb_rows = ROUND_POWER_OF_TWO(max_mi_rows, 2);
  }

  // Number of rows in the unit size.
  // Note max_mb_rows and max_mb_cols are in the unit of 16x16.
  const int unit_rows = get_unit_rows(fp_block_size, max_mb_rows);
  const int unit_cols = get_unit_cols(fp_block_size, max_mb_cols);

  // Set fp_block_size, for the convenience of multi-thread usage.
  cpi->fp_block_size = fp_block_size;

  setup_firstpass_data(cm, &cpi->firstpass_data, unit_rows, unit_cols);
  int *raw_motion_err_list = cpi->firstpass_data.raw_motion_err_list;
  FRAME_STATS *mb_stats = cpi->firstpass_data.mb_stats;

  // multi threading info
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &mt_info->enc_row_mt;

  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  if (cpi->allocated_tiles < tile_cols * tile_rows) {
    av1_alloc_tile_data(cpi);
  }

  av1_init_tile_data(cpi);

  const YV12_BUFFER_CONFIG *last_frame = NULL;
  const YV12_BUFFER_CONFIG *golden_frame = NULL;
  if (!frame_is_intra_only(cm)) {
    av1_scale_references(cpi, EIGHTTAP_REGULAR, 0, 0);
    last_frame = av1_is_scaled(get_ref_scale_factors_const(cm, LAST_FRAME))
                     ? av1_get_scaled_ref_frame(cpi, LAST_FRAME)
                     : get_ref_frame_yv12_buf(cm, LAST_FRAME);
    golden_frame = av1_is_scaled(get_ref_scale_factors_const(cm, GOLDEN_FRAME))
                       ? av1_get_scaled_ref_frame(cpi, GOLDEN_FRAME)
                       : get_ref_frame_yv12_buf(cm, GOLDEN_FRAME);
  }

  YV12_BUFFER_CONFIG *const this_frame = &cm->cur_frame->buf;
  // First pass code requires valid last and new frame buffers.
  assert(this_frame != NULL);
  assert(frame_is_intra_only(cm) || (last_frame != NULL));

  av1_setup_frame_size(cpi);
  av1_set_mv_search_params(cpi);

  set_mi_offsets(mi_params, xd, 0, 0);
  xd->mi[0]->bsize = fp_block_size;

  // Do not use periodic key frames.
  cpi->rc.frames_to_key = INT_MAX;

  av1_set_quantizer(
      cm, cpi->oxcf.q_cfg.qm_minlevel, cpi->oxcf.q_cfg.qm_maxlevel, qindex,
      cpi->oxcf.q_cfg.enable_chroma_deltaq, cpi->oxcf.q_cfg.enable_hdr_deltaq,
      cpi->oxcf.mode == ALLINTRA, cpi->oxcf.tune_cfg.tuning);

  av1_setup_block_planes(xd, seq_params->subsampling_x,
                         seq_params->subsampling_y, num_planes);

  av1_setup_src_planes(x, cpi->source, 0, 0, num_planes, fp_block_size);
  av1_setup_dst_planes(xd->plane, seq_params->sb_size, this_frame, 0, 0, 0,
                       num_planes);

  if (!frame_is_intra_only(cm)) {
    av1_setup_pre_planes(xd, 0, last_frame, 0, 0, NULL, num_planes);
  }

  set_mi_offsets(mi_params, xd, 0, 0);

  // Don't store luma on the fist pass since chroma is not computed
  xd->cfl.store_y = 0;
  av1_frame_init_quantizer(cpi);

  av1_default_coef_probs(cm);
  av1_init_mode_probs(cm->fc);
  av1_init_mv_probs(cm);
  av1_initialize_rd_consts(cpi);

  enc_row_mt->sync_read_ptr = av1_row_mt_sync_read_dummy;
  enc_row_mt->sync_write_ptr = av1_row_mt_sync_write_dummy;

  if (mt_info->num_workers > 1) {
    enc_row_mt->sync_read_ptr = av1_row_mt_sync_read;
    enc_row_mt->sync_write_ptr = av1_row_mt_sync_write;
    av1_fp_encode_tiles_row_mt(cpi);
  } else {
    first_pass_tiles(cpi, fp_block_size);
  }

  FRAME_STATS stats = accumulate_frame_stats(mb_stats, unit_rows, unit_cols);
  int total_raw_motion_err_count =
      frame_is_intra_only(cm) ? 0 : unit_rows * unit_cols;
  const double raw_err_stdev =
      raw_motion_error_stdev(raw_motion_err_list, total_raw_motion_err_count);
  av1_free_firstpass_data(&cpi->firstpass_data);
  av1_dealloc_src_diff_buf(&cpi->td.mb, av1_num_planes(cm));

  // Clamp the image start to rows/2. This number of rows is discarded top
  // and bottom as dead data so rows / 2 means the frame is blank.
  if ((stats.image_data_start_row > unit_rows / 2) ||
      (stats.image_data_start_row == INVALID_ROW)) {
    stats.image_data_start_row = unit_rows / 2;
  }
  // Exclude any image dead zone
  if (stats.image_data_start_row > 0) {
    stats.intra_skip_count =
        AOMMAX(0, stats.intra_skip_count -
                      (stats.image_data_start_row * unit_cols * 2));
  }

  TWO_PASS *twopass = &cpi->ppi->twopass;
  const int num_mbs_16X16 = (cpi->oxcf.resize_cfg.resize_mode != RESIZE_NONE)
                                ? cpi->initial_mbs
                                : mi_params->MBs;
  // Number of actual units used in the first pass, it can be other square
  // block sizes than 16X16.
  const int num_mbs = get_num_mbs(fp_block_size, num_mbs_16X16);
  stats.intra_factor = stats.intra_factor / (double)num_mbs;
  stats.brightness_factor = stats.brightness_factor / (double)num_mbs;
  FIRSTPASS_STATS *this_frame_stats = twopass->stats_buf_ctx->stats_in_end;
  update_firstpass_stats(cpi, &stats, raw_err_stdev,
                         current_frame->frame_number, ts_duration,
                         fp_block_size);

  // Copy the previous Last Frame back into gf buffer if the prediction is good
  // enough... but also don't allow it to lag too far.
  if ((twopass->sr_update_lag > 3) ||
      ((current_frame->frame_number > 0) &&
       (this_frame_stats->pcnt_inter > 0.20) &&
       ((this_frame_stats->intra_error /
         DOUBLE_DIVIDE_CHECK(this_frame_stats->coded_error)) > 2.0))) {
    if (golden_frame != NULL) {
      assign_frame_buffer_p(
          &cm->ref_frame_map[get_ref_frame_map_idx(cm, GOLDEN_FRAME)],
          cm->ref_frame_map[get_ref_frame_map_idx(cm, LAST_FRAME)]);
    }
    twopass->sr_update_lag = 1;
  } else {
    ++twopass->sr_update_lag;
  }

  aom_extend_frame_borders(this_frame, num_planes);

  // The frame we just compressed now becomes the last frame.
  assign_frame_buffer_p(
      &cm->ref_frame_map[get_ref_frame_map_idx(cm, LAST_FRAME)], cm->cur_frame);

  // Special case for the first frame. Copy into the GF buffer as a second
  // reference.
  if (current_frame->frame_number == 0 &&
      get_ref_frame_map_idx(cm, GOLDEN_FRAME) != INVALID_IDX) {
    assign_frame_buffer_p(
        &cm->ref_frame_map[get_ref_frame_map_idx(cm, GOLDEN_FRAME)],
        cm->ref_frame_map[get_ref_frame_map_idx(cm, LAST_FRAME)]);
  }

  print_reconstruction_frame(last_frame, current_frame->frame_number,
                             /*do_print=*/0);

  ++current_frame->frame_number;
  cpi->ref_frame_flags = ref_frame_flags_backup;
  if (!frame_is_intra_only(cm)) {
    release_scaled_references(cpi);
  }
}